

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::chooseColumn(HDual *this,HVector *row_ep)

{
  reference pvVar1;
  int *piVar2;
  reference pvVar3;
  double *pdVar4;
  long in_RDI;
  HVector *in_stack_00000010;
  HVector *in_stack_00000018;
  HMatrix *in_stack_00000020;
  int i_te;
  double dvx_rao;
  double pv;
  int vr_n;
  int el_n;
  double tru_dvx_wt_o_rowOut;
  int dvx_ix_o_vr_t_lv_bs;
  int vr_t_lv_bs;
  double og_dvx_wt_o_rowOut;
  HDualRow *in_stack_000000a0;
  int in_stack_ffffffffffffff7c;
  HTimer *in_stack_ffffffffffffff80;
  double dVar5;
  bool local_71;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  double local_58;
  double in_stack_ffffffffffffffb0;
  HVector *in_stack_ffffffffffffffb8;
  double dVar6;
  HDualRow *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar7;
  HVector *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (*(int *)(in_RDI + 0x15c) == 0) {
    HTimer::recordStart(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    HVector::clear((HVector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    HMatrix::price_by_row(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    HTimer::recordFinish(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    HTimer::recordStart(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    HDualRow::clear((HDualRow *)(in_RDI + 0x510));
    *(undefined8 *)(in_RDI + 0x5a8) = *(undefined8 *)(in_RDI + 0x6d0);
    HDualRow::create_Freemove
              ((HDualRow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
    HDualRow::choose_makepack(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,iVar7);
    HDualRow::choose_makepack(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,iVar7);
    HDualRow::choose_possible
              ((HDualRow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    HTimer::recordFinish(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    *(undefined4 *)(in_RDI + 0x6cc) = 0xffffffff;
    if ((*(double *)(in_RDI + 0x5b8) <= 0.0) || (*(int *)(in_RDI + 0x5c4) == 0)) {
      *(undefined4 *)(in_RDI + 0x15c) = 5;
    }
    else {
      HDualRow::choose_final(in_stack_000000a0);
      HDualRow::delete_Freemove
                ((HDualRow *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      *(undefined4 *)(in_RDI + 0x6cc) = *(undefined4 *)(in_RDI + 0x5c0);
      *(undefined8 *)(in_RDI + 0x6f0) = *(undefined8 *)(in_RDI + 0x5b0);
      *(undefined8 *)(in_RDI + 0x6d8) = *(undefined8 *)(in_RDI + 0x5b8);
      if (*(int *)(in_RDI + 4) == 1) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x660),
                            (long)*(int *)(in_RDI + 0x6c0));
        dVar6 = *pvVar1;
        piVar2 = HModel::getBaseIndex((HModel *)0x149b5f);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),
                   (long)piVar2[*(int *)(in_RDI + 0x6c0)]);
        for (iVar7 = 0; iVar7 < *(int *)(in_RDI + 0x570); iVar7 = iVar7 + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x578),(long)iVar7);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)*pvVar3);
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x590),(long)iVar7);
        }
        pdVar4 = std::max<double>((double *)&stack0xffffffffffffffc0,
                                  (double *)&stack0xffffffffffffffd8);
        dVar5 = *pdVar4;
        local_58 = dVar5 / dVar6;
        pdVar4 = std::max<double>((double *)&stack0xffffffffffffffb0,&local_58);
        dVar6 = *pdVar4;
        piVar2 = std::max<int>(&mn_n_dvx_it,(int *)&stack0xffffffffffffffa4);
        local_71 = true;
        if (dVar6 <= 9.0) {
          local_71 = *piVar2 < *(int *)(in_RDI + 0x34);
        }
        *(bool *)(in_RDI + 0x38) = local_71;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x660),
                            (long)*(int *)(in_RDI + 0x6c0));
        *pvVar1 = dVar5;
      }
    }
  }
  return;
}

Assistant:

void HDual::chooseColumn(HVector *row_ep) {

	if (invertHint)
		return;

	// Compute pivot row
	model->timer.recordStart(HTICK_PRICE);
	row_ap.clear();
	matrix->price_by_row(row_ap, *row_ep);
	model->timer.recordFinish(HTICK_PRICE);

	// Choose column - possible
	model->timer.recordStart(HTICK_CHUZC1);
	dualRow.clear();
	dualRow.workDelta = deltaPrimal;
	dualRow.create_Freemove(row_ep);
	dualRow.choose_makepack(&row_ap, 0);
	dualRow.choose_makepack(row_ep, numCol);
	dualRow.choose_possible();
	model->timer.recordFinish(HTICK_CHUZC1);

	// Choose column - check problem
	columnIn = -1;
	if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
   	  invertHint = invertHint_possiblyDualUnbounded; // Was 1
		return;
	}

	// Choose column - final
	dualRow.choose_final();
	dualRow.delete_Freemove();

	columnIn = dualRow.workPivot;
	alphaRow = dualRow.workAlpha;
	thetaDual = dualRow.workTheta;

	if (rp_hsol && rowOut >= 0) {
		printf("\nPvR: Row %2d\n", rowOut);
		dualRow.rp_hsol_pv_r();
	}
	if (EdWt_Mode == EdWt_Mode_Dvx) {
		//
		//Determine the exact Devex weight
		//
//    	int dvx_ix_o_columnIn = dvx_ix[columnIn];
//    	int si_it_n = model->numberIteration;
		double og_dvx_wt_o_rowOut = dualRHS.workEdWt[rowOut];
		int vr_t_lv_bs = model->getBaseIndex()[rowOut];
		int dvx_ix_o_vr_t_lv_bs = dvx_ix[vr_t_lv_bs];
		if (vr_t_lv_bs < numCol) {
//    		Structural leaving the basis
			if (rp_dvx)
				printf("\n DvxIt %d; RowOut %d; VrOut %d Str: DvxIx %d\n",
						n_dvx_it, rowOut, vr_t_lv_bs, dvx_ix_o_vr_t_lv_bs);
		} else {
//    		Logical leaving the basis
			if (rp_dvx)
				printf("\n DvxIt %d; RowOut %d; VrOut %d  Lg: DvxIx %d\n",
						n_dvx_it, rowOut, vr_t_lv_bs, dvx_ix_o_vr_t_lv_bs);
		}
		double tru_dvx_wt_o_rowOut = 0;
		//    	Have to loop over [row_ap; row_ep]
		for (int el_n = 0; el_n < dualRow.packCount; el_n++) {
			int vr_n = dualRow.packIndex[el_n];
			double pv = dvx_ix[vr_n] * dualRow.packValue[el_n];
			tru_dvx_wt_o_rowOut += pv * pv;
		}
		if (rp_dvx)
			printf("Sum of squares for Devex weight = %g\n",
					tru_dvx_wt_o_rowOut);
		tru_dvx_wt_o_rowOut = max(1.0, tru_dvx_wt_o_rowOut);
		if (rp_dvx)
			printf("tru_dvx_wt_o_rowOut = %g; alphaRow = %g\n",
					tru_dvx_wt_o_rowOut, alphaRow);
		//Analyse the Devex weight to determine whether a new framework should be set up
		double dvx_rao = max(og_dvx_wt_o_rowOut / tru_dvx_wt_o_rowOut,
				tru_dvx_wt_o_rowOut / og_dvx_wt_o_rowOut);
		int i_te = numRow / nw_dvx_fwk_fq;
		if (rp_dvx)
			printf("i_te = %d; %d: dvx_rao = %8.2g\n", i_te,
					max(mn_n_dvx_it, i_te), dvx_rao);
		i_te = max(mn_n_dvx_it, i_te);
//		Square tl_dvx_wt due to keeping squared weights
		nw_dvx_fwk = dvx_rao > tl_dvx_wt * tl_dvx_wt || n_dvx_it > i_te;
		if (nw_dvx_fwk)
			if (rp_dvx)
				printf("!!NEW DEVEX FRAMEWORK!!\n");
		dualRHS.workEdWt[rowOut] = tru_dvx_wt_o_rowOut;
	}

}